

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O2

Node * __thiscall ScapeGoatTree::findMax(ScapeGoatTree *this,Node *node)

{
  Node *pNVar1;
  
  do {
    pNVar1 = node;
    if (node == (Node *)0x0) {
      return pNVar1;
    }
    node = node->rightChild;
  } while (node != (Node *)0x0);
  return pNVar1;
}

Assistant:

ScapeGoatTree::Node *ScapeGoatTree::findMax(Node *node) {
    if (node == nullptr) {
        return nullptr;
    } else if (node->rightChild == nullptr) {
        return node;
    } else {
        return findMax(node->rightChild);
    }
}